

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall doctest::Context::parseArgs(Context *this,int argc,char **argv,bool withDefaults)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ContextState *pCVar4;
  int intRes;
  String strRes;
  String local_40;
  String local_38;
  
  detail::parseCommaSepArgs
            (argc,argv,"dt-source-file=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  detail::parseCommaSepArgs
            (argc,argv,"dt-sf=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  detail::parseCommaSepArgs
            (argc,argv,"dt-source-file-exclude=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1);
  detail::parseCommaSepArgs
            (argc,argv,"dt-sfe=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1);
  detail::parseCommaSepArgs
            (argc,argv,"dt-test-suite=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 2);
  detail::parseCommaSepArgs
            (argc,argv,"dt-ts=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 2);
  detail::parseCommaSepArgs
            (argc,argv,"dt-test-suite-exclude=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 3);
  detail::parseCommaSepArgs
            (argc,argv,"dt-tse=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 3);
  detail::parseCommaSepArgs
            (argc,argv,"dt-test-case=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 4);
  detail::parseCommaSepArgs
            (argc,argv,"dt-tc=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 4);
  detail::parseCommaSepArgs
            (argc,argv,"dt-test-case-exclude=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 5);
  detail::parseCommaSepArgs
            (argc,argv,"dt-tce=",
             (this->p->filters).
             super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 5);
  intRes = 0;
  String::String(&strRes,"");
  String::String(&local_40,"file");
  bVar1 = detail::parseOption(argc,argv,"dt-order-by=",&strRes,&local_40);
  if (bVar1) {
    free(local_40.m_str);
LAB_0011a3f4:
    String::operator=(&this->p->order_by,&strRes);
  }
  else {
    String::String(&local_38,"file");
    bVar1 = detail::parseOption(argc,argv,"dt-ob=",&strRes,&local_38);
    free(local_38.m_str);
    free(local_40.m_str);
    if (bVar1 || withDefaults) goto LAB_0011a3f4;
  }
  bVar1 = detail::parseIntOption(argc,argv,"dt-rand-seed=",option_int,&intRes);
  uVar2 = intRes;
  if (((bVar1) ||
      (bVar1 = detail::parseIntOption(argc,argv,"dt-rs=",option_int,&intRes), uVar2 = intRes, bVar1)
      ) || (uVar2 = 0, withDefaults)) {
    this->p->rand_seed = uVar2;
  }
  bVar1 = detail::parseIntOption(argc,argv,"dt-first=",option_int,&intRes);
  uVar2 = intRes;
  if (bVar1) {
LAB_0011a494:
    this->p->first = uVar2;
  }
  else {
    bVar1 = detail::parseIntOption(argc,argv,"dt-f=",option_int,&intRes);
    uVar2 = intRes;
    if ((bVar1) || (uVar2 = 1, withDefaults)) goto LAB_0011a494;
  }
  bVar1 = detail::parseIntOption(argc,argv,"dt-last=",option_int,&intRes);
  uVar2 = intRes;
  if (((bVar1) ||
      (bVar1 = detail::parseIntOption(argc,argv,"dt-l=",option_int,&intRes), uVar2 = intRes, bVar1))
     || (uVar2 = 0, withDefaults)) {
    this->p->last = uVar2;
  }
  bVar1 = detail::parseIntOption(argc,argv,"dt-abort-after=",option_int,&intRes);
  iVar3 = intRes;
  if (((bVar1) ||
      (bVar1 = detail::parseIntOption(argc,argv,"dt-aa=",option_int,&intRes), iVar3 = intRes, bVar1)
      ) || (iVar3 = 0, withDefaults)) {
    this->p->abort_after = iVar3;
  }
  bVar1 = detail::parseIntOption(argc,argv,"dt-success=",option_bool,&intRes);
  if ((bVar1) || (bVar1 = detail::parseIntOption(argc,argv,"dt-s=",option_bool,&intRes), bVar1)) {
    (this->p->super_TestAccessibleContextState).success = intRes != 0;
  }
  else {
    bVar1 = detail::parseFlag(argc,argv,"dt-success");
    if ((bVar1) || (bVar1 = detail::parseFlag(argc,argv,"dt-s"), bVar1)) {
      (this->p->super_TestAccessibleContextState).success = true;
    }
    else if (withDefaults) {
      (this->p->super_TestAccessibleContextState).success = false;
    }
  }
  bVar1 = detail::parseIntOption(argc,argv,"dt-case-sensitive=",option_bool,&intRes);
  if ((bVar1) || (bVar1 = detail::parseIntOption(argc,argv,"dt-cs=",option_bool,&intRes), bVar1)) {
    this->p->case_sensitive = intRes != 0;
  }
  else {
    bVar1 = detail::parseFlag(argc,argv,"dt-case-sensitive");
    if ((bVar1) || (bVar1 = detail::parseFlag(argc,argv,"dt-cs"), bVar1)) {
      this->p->case_sensitive = true;
    }
    else if (withDefaults) {
      this->p->case_sensitive = false;
    }
  }
  bVar1 = detail::parseIntOption(argc,argv,"dt-exit=",option_bool,&intRes);
  if ((bVar1) || (bVar1 = detail::parseIntOption(argc,argv,"dt-e=",option_bool,&intRes), bVar1)) {
    this->p->exit = intRes != 0;
  }
  else {
    bVar1 = detail::parseFlag(argc,argv,"dt-exit");
    if ((bVar1) || (bVar1 = detail::parseFlag(argc,argv,"dt-e"), bVar1)) {
      this->p->exit = true;
    }
    else if (withDefaults) {
      this->p->exit = false;
    }
  }
  bVar1 = detail::parseIntOption(argc,argv,"dt-no-throw=",option_bool,&intRes);
  if ((bVar1) || (bVar1 = detail::parseIntOption(argc,argv,"dt-nt=",option_bool,&intRes), bVar1)) {
    (this->p->super_TestAccessibleContextState).no_throw = intRes != 0;
  }
  else {
    bVar1 = detail::parseFlag(argc,argv,"dt-no-throw");
    if ((bVar1) || (bVar1 = detail::parseFlag(argc,argv,"dt-nt"), bVar1)) {
      (this->p->super_TestAccessibleContextState).no_throw = true;
    }
    else if (withDefaults) {
      (this->p->super_TestAccessibleContextState).no_throw = false;
    }
  }
  bVar1 = detail::parseIntOption(argc,argv,"dt-no-exitcode=",option_bool,&intRes);
  if ((bVar1) || (bVar1 = detail::parseIntOption(argc,argv,"dt-ne=",option_bool,&intRes), bVar1)) {
    this->p->no_exitcode = intRes != 0;
  }
  else {
    bVar1 = detail::parseFlag(argc,argv,"dt-no-exitcode");
    if ((bVar1) || (bVar1 = detail::parseFlag(argc,argv,"dt-ne"), bVar1)) {
      this->p->no_exitcode = true;
    }
    else if (withDefaults) {
      this->p->no_exitcode = false;
    }
  }
  bVar1 = detail::parseIntOption(argc,argv,"dt-no-run=",option_bool,&intRes);
  if ((bVar1) || (bVar1 = detail::parseIntOption(argc,argv,"dt-nr=",option_bool,&intRes), bVar1)) {
    this->p->no_run = intRes != 0;
  }
  else {
    bVar1 = detail::parseFlag(argc,argv,"dt-no-run");
    if ((bVar1) || (bVar1 = detail::parseFlag(argc,argv,"dt-nr"), bVar1)) {
      this->p->no_run = true;
    }
    else if (withDefaults) {
      this->p->no_run = false;
    }
  }
  bVar1 = detail::parseIntOption(argc,argv,"dt-no-version=",option_bool,&intRes);
  if ((bVar1) || (bVar1 = detail::parseIntOption(argc,argv,"dt-nv=",option_bool,&intRes), bVar1)) {
    this->p->no_version = intRes != 0;
  }
  else {
    bVar1 = detail::parseFlag(argc,argv,"dt-no-version");
    if ((bVar1) || (bVar1 = detail::parseFlag(argc,argv,"dt-nv"), bVar1)) {
      this->p->no_version = true;
    }
    else if (withDefaults) {
      this->p->no_version = false;
    }
  }
  bVar1 = detail::parseIntOption(argc,argv,"dt-no-colors=",option_bool,&intRes);
  if ((bVar1) || (bVar1 = detail::parseIntOption(argc,argv,"dt-nc=",option_bool,&intRes), bVar1)) {
    this->p->no_colors = intRes != 0;
  }
  else {
    bVar1 = detail::parseFlag(argc,argv,"dt-no-colors");
    if ((bVar1) || (bVar1 = detail::parseFlag(argc,argv,"dt-nc"), bVar1)) {
      this->p->no_colors = true;
    }
    else if (withDefaults) {
      this->p->no_colors = false;
    }
  }
  bVar1 = detail::parseIntOption(argc,argv,"dt-no-breaks=",option_bool,&intRes);
  if ((bVar1) || (bVar1 = detail::parseIntOption(argc,argv,"dt-nb=",option_bool,&intRes), bVar1)) {
    (this->p->super_TestAccessibleContextState).no_breaks = intRes != 0;
  }
  else {
    bVar1 = detail::parseFlag(argc,argv,"dt-no-breaks");
    if ((bVar1) || (bVar1 = detail::parseFlag(argc,argv,"dt-nb"), bVar1)) {
      (this->p->super_TestAccessibleContextState).no_breaks = true;
    }
    else if (withDefaults) {
      (this->p->super_TestAccessibleContextState).no_breaks = false;
    }
  }
  bVar1 = detail::parseIntOption(argc,argv,"dt-no-path-filenames=",option_bool,&intRes);
  if ((bVar1) || (bVar1 = detail::parseIntOption(argc,argv,"dt-npf=",option_bool,&intRes), bVar1)) {
    pCVar4 = this->p;
    pCVar4->no_path_in_filenames = intRes != 0;
LAB_0011a7fa:
    if (!withDefaults) goto LAB_0011a807;
  }
  else {
    bVar1 = detail::parseFlag(argc,argv,"dt-no-path-filenames");
    if ((bVar1) || (bVar1 = detail::parseFlag(argc,argv,"dt-npf"), bVar1)) {
      pCVar4 = this->p;
      pCVar4->no_path_in_filenames = true;
      goto LAB_0011a7fa;
    }
    if (!withDefaults) goto LAB_0011a807;
    pCVar4 = this->p;
    pCVar4->no_path_in_filenames = false;
  }
  pCVar4->list_test_suites = false;
  pCVar4->help = false;
  pCVar4->version = false;
  pCVar4->count = false;
  pCVar4->list_test_cases = false;
LAB_0011a807:
  bVar1 = detail::parseFlag(argc,argv,"dt-help");
  if (((bVar1) || (bVar1 = detail::parseFlag(argc,argv,"dt-h"), bVar1)) ||
     (bVar1 = detail::parseFlag(argc,argv,"dt-?"), bVar1)) {
    pCVar4 = this->p;
    pCVar4->help = true;
    pCVar4->exit = true;
  }
  bVar1 = detail::parseFlag(argc,argv,"dt-version");
  if ((bVar1) || (bVar1 = detail::parseFlag(argc,argv,"dt-v"), bVar1)) {
    pCVar4 = this->p;
    pCVar4->version = true;
    pCVar4->exit = true;
  }
  bVar1 = detail::parseFlag(argc,argv,"dt-count");
  if ((bVar1) || (bVar1 = detail::parseFlag(argc,argv,"dt-c"), bVar1)) {
    pCVar4 = this->p;
    pCVar4->count = true;
    pCVar4->exit = true;
  }
  bVar1 = detail::parseFlag(argc,argv,"dt-list-test-cases");
  if ((bVar1) || (bVar1 = detail::parseFlag(argc,argv,"dt-ltc"), bVar1)) {
    pCVar4 = this->p;
    pCVar4->list_test_cases = true;
    pCVar4->exit = true;
  }
  bVar1 = detail::parseFlag(argc,argv,"dt-list-test-suites");
  if ((bVar1) || (bVar1 = detail::parseFlag(argc,argv,"dt-lts"), bVar1)) {
    pCVar4 = this->p;
    pCVar4->list_test_suites = true;
    pCVar4->exit = true;
  }
  free(strRes.m_str);
  return;
}

Assistant:

void Context::parseArgs(int argc, const char* const* argv, bool withDefaults) {
    using namespace detail;

    // clang-format off
    parseCommaSepArgs(argc, argv, "dt-source-file=",        p->filters[0]);
    parseCommaSepArgs(argc, argv, "dt-sf=",                 p->filters[0]);
    parseCommaSepArgs(argc, argv, "dt-source-file-exclude=",p->filters[1]);
    parseCommaSepArgs(argc, argv, "dt-sfe=",                p->filters[1]);
    parseCommaSepArgs(argc, argv, "dt-test-suite=",         p->filters[2]);
    parseCommaSepArgs(argc, argv, "dt-ts=",                 p->filters[2]);
    parseCommaSepArgs(argc, argv, "dt-test-suite-exclude=", p->filters[3]);
    parseCommaSepArgs(argc, argv, "dt-tse=",                p->filters[3]);
    parseCommaSepArgs(argc, argv, "dt-test-case=",          p->filters[4]);
    parseCommaSepArgs(argc, argv, "dt-tc=",                 p->filters[4]);
    parseCommaSepArgs(argc, argv, "dt-test-case-exclude=",  p->filters[5]);
    parseCommaSepArgs(argc, argv, "dt-tce=",                p->filters[5]);
    // clang-format on

    int    intRes = 0;
    String strRes;

#define DOCTEST_PARSE_AS_BOOL_OR_FLAG(name, sname, var, default)                                   \
    if(parseIntOption(argc, argv, DOCTEST_STR_CONCAT_TOSTR(name, =), option_bool, intRes) ||       \
       parseIntOption(argc, argv, DOCTEST_STR_CONCAT_TOSTR(sname, =), option_bool, intRes))        \
        p->var = !!intRes;                                                                         \
    else if(parseFlag(argc, argv, #name) || parseFlag(argc, argv, #sname))                         \
        p->var = 1;                                                                                \
    else if(withDefaults)                                                                          \
    p->var = default

#define DOCTEST_PARSE_INT_OPTION(name, sname, var, default)                                        \
    if(parseIntOption(argc, argv, DOCTEST_STR_CONCAT_TOSTR(name, =), option_int, intRes) ||        \
       parseIntOption(argc, argv, DOCTEST_STR_CONCAT_TOSTR(sname, =), option_int, intRes))         \
        p->var = intRes;                                                                           \
    else if(withDefaults)                                                                          \
    p->var = default

#define DOCTEST_PARSE_STR_OPTION(name, sname, var, default)                                        \
    if(parseOption(argc, argv, DOCTEST_STR_CONCAT_TOSTR(name, =), strRes, default) ||              \
       parseOption(argc, argv, DOCTEST_STR_CONCAT_TOSTR(sname, =), strRes, default) ||             \
       withDefaults)                                                                               \
    p->var = strRes

    // clang-format off
    DOCTEST_PARSE_STR_OPTION(dt-order-by, dt-ob, order_by, "file");
    DOCTEST_PARSE_INT_OPTION(dt-rand-seed, dt-rs, rand_seed, 0);

    DOCTEST_PARSE_INT_OPTION(dt-first, dt-f, first, 1);
    DOCTEST_PARSE_INT_OPTION(dt-last, dt-l, last, 0);

    DOCTEST_PARSE_INT_OPTION(dt-abort-after, dt-aa, abort_after, 0);

    DOCTEST_PARSE_AS_BOOL_OR_FLAG(dt-success, dt-s, success, 0);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG(dt-case-sensitive, dt-cs, case_sensitive, 0);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG(dt-exit, dt-e, exit, 0);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG(dt-no-throw, dt-nt, no_throw, 0);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG(dt-no-exitcode, dt-ne, no_exitcode, 0);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG(dt-no-run, dt-nr, no_run, 0);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG(dt-no-version, dt-nv, no_version, 0);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG(dt-no-colors, dt-nc, no_colors, 0);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG(dt-no-breaks, dt-nb, no_breaks, 0);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG(dt-no-path-filenames, dt-npf, no_path_in_filenames, 0);
// clang-format on

#undef DOCTEST_PARSE_STR_OPTION
#undef DOCTEST_PARSE_INT_OPTION
#undef DOCTEST_PARSE_AS_BOOL_OR_FLAG

    if(withDefaults) {
        p->help             = false;
        p->version          = false;
        p->count            = false;
        p->list_test_cases  = false;
        p->list_test_suites = false;
    }
    if(parseFlag(argc, argv, "dt-help") || parseFlag(argc, argv, "dt-h") ||
       parseFlag(argc, argv, "dt-?")) {
        p->help = true;
        p->exit = true;
    }
    if(parseFlag(argc, argv, "dt-version") || parseFlag(argc, argv, "dt-v")) {
        p->version = true;
        p->exit    = true;
    }
    if(parseFlag(argc, argv, "dt-count") || parseFlag(argc, argv, "dt-c")) {
        p->count = true;
        p->exit  = true;
    }
    if(parseFlag(argc, argv, "dt-list-test-cases") || parseFlag(argc, argv, "dt-ltc")) {
        p->list_test_cases = true;
        p->exit            = true;
    }
    if(parseFlag(argc, argv, "dt-list-test-suites") || parseFlag(argc, argv, "dt-lts")) {
        p->list_test_suites = true;
        p->exit             = true;
    }
}